

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,array_type *a,
          array_format_info *fmt,comment_type *com,source_location *loc)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  floating_type f;
  pointer pbVar3;
  basic_value<toml::type_config> *pbVar4;
  basic_value<toml::type_config> *pbVar5;
  integer_type i;
  pointer pcVar6;
  bool bVar7;
  size_type sVar8;
  table_format_info *ptVar9;
  table_type *t;
  __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  _Var10;
  boolean_type *b;
  boolean_format_info *pbVar11;
  floating_type *pfVar12;
  integer_type *piVar13;
  string_format_info *psVar14;
  string_type *psVar15;
  undefined8 *puVar16;
  array_format aVar17;
  ulong uVar18;
  pointer pbVar19;
  array_format aVar20;
  basic_value<toml::type_config> *e;
  undefined1 local_190 [32];
  char local_170;
  string_type local_118;
  integer_format_info *local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  string_type local_d0;
  source_location *local_b0;
  source_location local_a8;
  
  aVar20 = fmt->fmt;
  local_b0 = loc;
  if (aVar20 == default_format) {
    if ((this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar4 = (a->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (a->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (((pbVar4 != pbVar5) &&
          ((com->comments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (com->comments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) &&
         (_Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<toml::basic_value<toml::type_config>const*,std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,__gnu_cxx::__ops::_Iter_negate<toml::detail::serializer<toml::type_config>::operator()[abi:cxx11](std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>const&,toml::array_format_info_const&,toml::preserve_comments_const&,toml::source_location_const&)::_lambda(toml::basic_value<toml::type_config>const&)_1_>>
                             (pbVar4,pbVar5), _Var10._M_current == pbVar5)) {
        aVar20 = array_of_tables;
        goto LAB_003ec3b3;
      }
    }
    pbVar19 = (a->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (a->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    aVar20 = oneline;
    if (pbVar19 != pbVar3) {
      uVar18 = 0;
      do {
        if ((pbVar19->comments_).comments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pbVar19->comments_).comments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
switchD_003ec6c1_caseD_5:
          bVar7 = true;
          aVar20 = multiline;
          goto LAB_003ec899;
        }
        switch(pbVar19->type_) {
        case boolean:
          b = basic_value<toml::type_config>::as_boolean(pbVar19);
          pbVar11 = basic_value<toml::type_config>::as_boolean_fmt(pbVar19);
          source_location::source_location((source_location *)local_190,&pbVar19->region_);
          operator()[abi_cxx11_(&local_118,this,b,pbVar11,(source_location *)local_190);
          sVar8 = local_118._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_190);
          goto LAB_003ec83f;
        case integer:
          piVar13 = basic_value<toml::type_config>::as_integer(pbVar19);
          i = *piVar13;
          local_f8 = basic_value<toml::type_config>::as_integer_fmt(pbVar19);
          source_location::source_location((source_location *)local_190,&pbVar19->region_);
          operator()[abi_cxx11_(&local_118,this,i,local_f8,(source_location *)local_190);
          goto LAB_003ec7f9;
        case floating:
          pfVar12 = basic_value<toml::type_config>::as_floating(pbVar19);
          f = *pfVar12;
          local_f8 = (integer_format_info *)basic_value<toml::type_config>::as_floating_fmt(pbVar19)
          ;
          source_location::source_location((source_location *)local_190,&pbVar19->region_);
          operator()[abi_cxx11_
                    (&local_118,this,f,(floating_format_info *)local_f8,(source_location *)local_190
                    );
LAB_003ec7f9:
          sVar8 = local_118._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_190);
LAB_003ec83f:
          uVar18 = uVar18 + sVar8;
          break;
        case string:
          psVar14 = basic_value<toml::type_config>::as_string_fmt(pbVar19);
          if ((psVar14->fmt != multiline_basic) &&
             (psVar14 = basic_value<toml::type_config>::as_string_fmt(pbVar19),
             psVar14->fmt != multiline_literal)) {
            psVar15 = basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar19);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            pcVar6 = (psVar15->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar6,pcVar6 + psVar15->_M_string_length);
            psVar14 = basic_value<toml::type_config>::as_string_fmt(pbVar19);
            source_location::source_location((source_location *)local_190,&pbVar19->region_);
            operator()(&local_118,this,&local_d0,psVar14,(source_location *)local_190);
            sVar8 = local_118._M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location((source_location *)local_190);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            uVar18 = uVar18 + sVar8 + 2;
            break;
          }
          bVar7 = true;
          aVar20 = multiline;
          goto LAB_003ec899;
        case offset_datetime:
        case local_datetime:
        case array:
        case table:
          goto switchD_003ec6c1_caseD_5;
        case local_date:
          uVar18 = uVar18 + 10;
          break;
        default:
          if (pbVar19->type_ == local_time) {
            uVar18 = uVar18 + 0xf;
          }
        }
        if (uVar18 < 0x3d) {
          uVar18 = uVar18 + 2;
          bVar7 = false;
        }
        else {
          bVar7 = true;
          aVar20 = multiline;
        }
LAB_003ec899:
      } while ((!bVar7) && (pbVar19 = pbVar19 + 1, pbVar19 != pbVar3));
    }
  }
LAB_003ec3b3:
  aVar17 = multiline;
  if (aVar20 != array_of_tables) {
    aVar17 = aVar20;
  }
  if (this->force_inline_ == false) {
    aVar17 = aVar20;
  }
  pbVar19 = (a->
            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (a->
           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  aVar20 = oneline;
  if (aVar17 != array_of_tables) {
    aVar20 = aVar17;
  }
  if (pbVar19 != pbVar3) {
    aVar20 = aVar17;
  }
  if (aVar20 == oneline) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'[');
    pbVar19 = (a->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (a->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar19 != pbVar3) {
      pcVar1 = local_190 + 0x10;
      do {
        this->force_inline_ = true;
        operator()[abi_cxx11_((string_type *)local_190,this,pbVar19);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        local_190._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,", ","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        pbVar19 = pbVar19 + 1;
      } while (pbVar19 != pbVar3);
    }
    if ((a->
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (a->
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,']');
    this->force_inline_ = false;
  }
  else if (aVar20 == array_of_tables) {
    if ((this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar16 = (undefined8 *)__cxa_allocate_exception(0xa0);
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"array of table must have its key. use format(key, v)","");
      source_location::source_location(&local_a8,local_b0);
      *puVar16 = &PTR__serialization_error_00576820;
      puVar16[1] = puVar16 + 3;
      if (local_f0 == &local_e0) {
        puVar16[3] = CONCAT71(uStack_df,local_e0);
        puVar16[4] = uStack_d8;
      }
      else {
        puVar16[1] = local_f0;
        puVar16[3] = CONCAT71(uStack_df,local_e0);
      }
      puVar16[2] = local_e8;
      local_e8 = 0;
      local_e0 = 0;
      paVar2 = &local_a8.file_name_.field_2;
      *(undefined4 *)(puVar16 + 0xb) = (undefined4)local_a8.last_offset_;
      *(undefined4 *)((long)puVar16 + 0x5c) = local_a8.last_offset_._4_4_;
      *(undefined4 *)(puVar16 + 0xc) = (undefined4)local_a8.length_;
      *(undefined4 *)((long)puVar16 + 100) = local_a8.length_._4_4_;
      *(undefined4 *)(puVar16 + 9) = (undefined4)local_a8.last_line_;
      *(undefined4 *)((long)puVar16 + 0x4c) = local_a8.last_line_._4_4_;
      *(undefined4 *)(puVar16 + 10) = (undefined4)local_a8.last_column_;
      *(undefined4 *)((long)puVar16 + 0x54) = local_a8.last_column_._4_4_;
      *(undefined4 *)(puVar16 + 7) = (undefined4)local_a8.first_column_;
      *(undefined4 *)((long)puVar16 + 0x3c) = local_a8.first_column_._4_4_;
      *(undefined4 *)(puVar16 + 8) = (undefined4)local_a8.first_offset_;
      *(undefined4 *)((long)puVar16 + 0x44) = local_a8.first_offset_._4_4_;
      puVar16[5] = local_a8._0_8_;
      puVar16[6] = local_a8.first_line_;
      puVar16[0xd] = puVar16 + 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.file_name_._M_dataplus._M_p == paVar2) {
        puVar16[0xf] = CONCAT71(local_a8.file_name_.field_2._M_allocated_capacity._1_7_,
                                local_a8.file_name_.field_2._M_local_buf[0]);
        puVar16[0x10] = local_a8.file_name_.field_2._8_8_;
      }
      else {
        puVar16[0xd] = local_a8.file_name_._M_dataplus._M_p;
        puVar16[0xf] = CONCAT71(local_a8.file_name_.field_2._M_allocated_capacity._1_7_,
                                local_a8.file_name_.field_2._M_local_buf[0]);
      }
      puVar16[0xe] = local_a8.file_name_._M_string_length;
      local_a8.file_name_._M_string_length = 0;
      local_a8.file_name_.field_2._M_local_buf[0] = '\0';
      puVar16[0x11] =
           local_a8.line_str_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      puVar16[0x12] =
           local_a8.line_str_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      puVar16[0x13] =
           local_a8.line_str_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0 = &local_e0;
      local_a8.file_name_._M_dataplus._M_p = (pointer)paVar2;
      __cxa_throw(puVar16,&serialization_error::typeinfo,serialization_error::~serialization_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (pbVar19 != pbVar3) {
      pcVar1 = local_190 + 0x10;
      do {
        ptVar9 = basic_value<toml::type_config>::as_table_fmt(pbVar19);
        this->current_indent_ = this->current_indent_ + ptVar9->name_indent;
        ptVar9 = basic_value<toml::type_config>::as_table_fmt(pbVar19);
        format_comments_abi_cxx11_
                  ((string_type *)local_190,this,&pbVar19->comments_,ptVar9->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        ptVar9 = basic_value<toml::type_config>::as_table_fmt(pbVar19);
        format_indent_abi_cxx11_((string_type *)local_190,this,ptVar9->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        ptVar9 = basic_value<toml::type_config>::as_table_fmt(pbVar19);
        this->current_indent_ = this->current_indent_ - ptVar9->name_indent;
        local_190._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"[[","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        format_keys((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_190,this,&this->keys_);
        if (local_170 == '\0') {
          std::__throw_bad_optional_access();
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((local_170 == '\x01') && (local_170 = '\0', (char *)local_190._0_8_ != pcVar1)) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        local_190._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"]]\n","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        t = basic_value<toml::type_config>::as_table_abi_cxx11_(pbVar19);
        ptVar9 = basic_value<toml::type_config>::as_table_fmt(pbVar19);
        format_ml_table((string_type *)local_190,this,t,ptVar9);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        pbVar19 = pbVar19 + 1;
      } while (pbVar19 != pbVar3);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    pcVar1 = local_190 + 0x10;
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"[\n","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
    if ((char *)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    pbVar19 = (a->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (a->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar19 != pbVar3) {
      do {
        this->current_indent_ = this->current_indent_ + fmt->body_indent;
        format_comments_abi_cxx11_
                  ((string_type *)local_190,this,&pbVar19->comments_,fmt->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        format_indent_abi_cxx11_((string_type *)local_190,this,fmt->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        this->current_indent_ = this->current_indent_ - fmt->body_indent;
        this->force_inline_ = true;
        operator()[abi_cxx11_((string_type *)local_190,this,pbVar19);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        local_190._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,",\n","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        pbVar19 = pbVar19 + 1;
      } while (pbVar19 != pbVar3);
    }
    this->force_inline_ = false;
    this->current_indent_ = this->current_indent_ + fmt->closing_indent;
    format_indent_abi_cxx11_((string_type *)local_190,this,fmt->indent_type);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
    if ((char *)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    this->current_indent_ = this->current_indent_ - fmt->closing_indent;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,']');
  }
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const array_type& a, const array_format_info& fmt, const comment_type& com, const source_location& loc) // {{{
    {
        array_format f = fmt.fmt;
        if(fmt.fmt == array_format::default_format)
        {
            // [[in.this.form]], you cannot add a comment to the array itself
            // (but you can add a comment to each table).
            // To keep comments, we need to avoid multiline array-of-tables
            // if array itself has a comment.
            if( ! this->keys_.empty() &&
                ! a.empty() &&
                com.empty() &&
                std::all_of(a.begin(), a.end(), [](const value_type& e) {return e.is_table();}))
            {
                f = array_format::array_of_tables;
            }
            else
            {
                f = array_format::oneline;

                // check if it becomes long
                std::size_t approx_len = 0;
                for(const auto& e : a)
                {
                    // have a comment. cannot be inlined
                    if( ! e.comments().empty())
                    {
                        f = array_format::multiline;
                        break;
                    }
                    // possibly long types ...
                    if(e.is_array() || e.is_table() || e.is_offset_datetime() || e.is_local_datetime())
                    {
                        f = array_format::multiline;
                        break;
                    }
                    else if(e.is_boolean())
                    {
                        approx_len += (*this)(e.as_boolean(), e.as_boolean_fmt(), e.location()).size();
                    }
                    else if(e.is_integer())
                    {
                        approx_len += (*this)(e.as_integer(), e.as_integer_fmt(), e.location()).size();
                    }
                    else if(e.is_floating())
                    {
                        approx_len += (*this)(e.as_floating(), e.as_floating_fmt(), e.location()).size();
                    }
                    else if(e.is_string())
                    {
                        if(e.as_string_fmt().fmt == string_format::multiline_basic ||
                           e.as_string_fmt().fmt == string_format::multiline_literal)
                        {
                            f = array_format::multiline;
                            break;
                        }
                        approx_len += 2 + (*this)(e.as_string(), e.as_string_fmt(), e.location()).size();
                    }
                    else if(e.is_local_date())
                    {
                        approx_len += 10; // 1234-56-78
                    }
                    else if(e.is_local_time())
                    {
                        approx_len += 15; // 12:34:56.789012
                    }

                    if(approx_len > 60) // key, ` = `, `[...]` < 80
                    {
                        f = array_format::multiline;
                        break;
                    }
                    approx_len += 2; // `, `
                }
            }
        }
        if(this->force_inline_ && f == array_format::array_of_tables)
        {
            f = array_format::multiline;
        }
        if(a.empty() && f == array_format::array_of_tables)
        {
            f = array_format::oneline;
        }

        // --------------------------------------------------------------------

        if(f == array_format::array_of_tables)
        {
            if(this->keys_.empty())
            {
                throw serialization_error("array of table must have its key. "
                        "use format(key, v)", loc);
            }
            string_type retval;
            for(const auto& e : a)
            {
                assert(e.is_table());

                this->current_indent_ += e.as_table_fmt().name_indent;
                retval += this->format_comments(e.comments(), e.as_table_fmt().indent_type);
                retval += this->format_indent(e.as_table_fmt().indent_type);
                this->current_indent_ -= e.as_table_fmt().name_indent;

                retval += string_conv<string_type>("[[");
                retval += this->format_keys(this->keys_).value();
                retval += string_conv<string_type>("]]\n");

                retval += this->format_ml_table(e.as_table(), e.as_table_fmt());
            }
            return retval;
        }
        else if(f == array_format::oneline)
        {
            // ignore comments. we cannot emit comments
            string_type retval;
            retval += char_type('[');
            for(const auto& e : a)
            {
                this->force_inline_ = true;
                retval += (*this)(e);
                retval += string_conv<string_type>(", ");
            }
            if( ! a.empty())
            {
                retval.pop_back(); // ` `
                retval.pop_back(); // `,`
            }
            retval += char_type(']');
            this->force_inline_ = false;
            return retval;
        }
        else
        {
            assert(f == array_format::multiline);

            string_type retval;
            retval += string_conv<string_type>("[\n");

            for(const auto& e : a)
            {
                this->current_indent_ += fmt.body_indent;
                retval += this->format_comments(e.comments(), fmt.indent_type);
                retval += this->format_indent(fmt.indent_type);
                this->current_indent_ -= fmt.body_indent;

                this->force_inline_ = true;
                retval += (*this)(e);
                retval += string_conv<string_type>(",\n");
            }
            this->force_inline_ = false;

            this->current_indent_ += fmt.closing_indent;
            retval += this->format_indent(fmt.indent_type);
            this->current_indent_ -= fmt.closing_indent;

            retval += char_type(']');
            return retval;
        }
    }